

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

size_t __thiscall
cmGlobalUnixMakefileGenerator3::CountProgressMarksInAll
          (cmGlobalUnixMakefileGenerator3 *this,cmLocalGenerator *lg)

{
  bool bVar1;
  reference ppcVar2;
  size_t sVar3;
  cmGeneratorTarget *target;
  iterator __end1;
  iterator __begin1;
  cmStateSnapshot local_70;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *local_58;
  mapped_type *__range1;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  emitted;
  size_t count;
  cmLocalGenerator *lg_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
         *)&__range1);
  cmLocalGenerator::GetStateSnapshot(&local_70,lg);
  local_58 = std::
             map<cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
             ::operator[](&this->DirectoryTargetsMap,&local_70);
  __end1 = std::
           set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
           ::begin(local_58);
  target = (cmGeneratorTarget *)
           std::
           set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
           ::end(local_58);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&target);
    sVar3 = emitted._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (!bVar1) break;
    ppcVar2 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&__end1);
    sVar3 = CountProgressMarksInTarget
                      (this,*ppcVar2,
                       (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                        *)&__range1);
    emitted._M_t._M_impl.super__Rb_tree_header._M_node_count =
         sVar3 + emitted._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator++(&__end1);
  }
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *)&__range1);
  return sVar3;
}

Assistant:

size_t cmGlobalUnixMakefileGenerator3::CountProgressMarksInAll(
  cmLocalGenerator* lg)
{
  size_t count = 0;
  std::set<cmGeneratorTarget const*> emitted;
  for (cmGeneratorTarget const* target :
       this->DirectoryTargetsMap[lg->GetStateSnapshot()]) {
    count += this->CountProgressMarksInTarget(target, emitted);
  }
  return count;
}